

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O2

bool __thiscall
ConvexBuilder::isDuplicate(ConvexBuilder *this,uint i1,uint i2,uint i3,uint ci1,uint ci2,uint ci3)

{
  uint __line;
  char cVar1;
  char cVar2;
  char *__assertion;
  
  if (((i2 == i3) || (i1 == i2)) || (i1 == i3)) {
    __assertion = "i1 != i2 && i1 != i3 && i2 != i3";
    __line = 0x4a;
  }
  else {
    if (((ci2 != ci3) && (ci1 != ci2)) && (ci1 != ci3)) {
      cVar1 = i1 == ci3 || (i1 == ci2 || i1 == ci1);
      cVar2 = cVar1 + '\x01';
      if (i2 == ci3) {
        cVar1 = cVar2;
      }
      if (i2 == ci2) {
        cVar1 = cVar2;
      }
      if (i2 == ci1) {
        cVar1 = cVar2;
      }
      return (char)((i3 == ci3 || (i3 == ci2 || i3 == ci1)) + cVar1) == '\x03';
    }
    __assertion = "ci1 != ci2 && ci1 != ci3 && ci2 != ci3";
    __line = 0x4b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexBuilder.cpp"
                ,__line,
                "bool ConvexBuilder::isDuplicate(unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int)"
               );
}

Assistant:

bool ConvexBuilder::isDuplicate(unsigned int i1,unsigned int i2,unsigned int i3,
								unsigned int ci1,unsigned int ci2,unsigned int ci3)
{
	unsigned int dcount = 0;

	assert( i1 != i2 && i1 != i3 && i2 != i3 );
	assert( ci1 != ci2 && ci1 != ci3 && ci2 != ci3 );

	if ( i1 == ci1 || i1 == ci2 || i1 == ci3 ) dcount++;
	if ( i2 == ci1 || i2 == ci2 || i2 == ci3 ) dcount++;
	if ( i3 == ci1 || i3 == ci2 || i3 == ci3 ) dcount++;

	return dcount == 3;
}